

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr_wrapper.hpp
# Opt level: O0

attr_wrapper * __thiscall
attr_wrapper::get_attribute<std::__cxx11::string>(attr_wrapper *this,Value *doc,char *name)

{
  ConstMemberIterator CVar1;
  bool bVar2;
  SizeType SVar3;
  Pointer pGVar4;
  Type_error *__return_storage_ptr__;
  Ch *pCVar5;
  allocator local_83;
  undefined1 local_82;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  ConstMemberIterator loc;
  char *name_local;
  Value *doc_local;
  
  loc.ptr_ = (Pointer)name;
  local_28.ptr_ = (Pointer)get_loc(doc,name);
  pGVar4 = rapidjson::
           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator->(&local_28);
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsString(&pGVar4->value);
  if (!bVar2) {
    local_82 = 1;
    __return_storage_ptr__ = (Type_error *)__cxa_allocate_exception(0x10);
    CVar1 = loc;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,(char *)CVar1.ptr_,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80," string",&local_81);
    genTypeError(__return_storage_ptr__,(string *)local_48,(string *)local_80);
    local_82 = 0;
    __cxa_throw(__return_storage_ptr__,&Type_error::typeinfo,Type_error::~Type_error);
  }
  pGVar4 = rapidjson::
           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator->(&local_28);
  pCVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(&pGVar4->value);
  pGVar4 = rapidjson::
           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator->(&local_28);
  SVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetStringLength(&pGVar4->value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pCVar5,(ulong)SVar3,&local_83);
  std::allocator<char>::~allocator((allocator<char> *)&local_83);
  return this;
}

Assistant:

inline std::string get_attribute<std::string>(const rapidjson::Value& doc,
                                                 const char* name)
   {
      auto loc = get_loc(doc, name);
      if(!loc->value.IsString())
      {
         throw genTypeError(name, " string");
      }
      return std::string(loc->value.GetString(), loc->value.GetStringLength());
   }